

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O3

void __thiscall
glu::sl::ShaderParser::parseShaderGroup
          (ShaderParser *this,
          vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> *shaderNodeList)

{
  Token TVar1;
  pointer pcVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  ShaderParser *this_00;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> children;
  string name;
  string description;
  vector<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_> local_a8;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  assumeToken(this,TOKEN_GROUP);
  advanceToken(this);
  pcVar2 = (this->m_curTokenStr)._M_dataplus._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar2,pcVar2 + (this->m_curTokenStr)._M_string_length);
  advanceToken(this);
  this_00 = (ShaderParser *)0x2;
  assumeToken(this,TOKEN_STRING);
  parseStringLiteral_abi_cxx11_(&local_68,this_00,(this->m_curTokenStr)._M_dataplus._M_p);
  assumeToken(this,TOKEN_STRING);
  advanceToken(this);
  local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    while (TVar1 = this->m_curToken, (int)TVar1 < 0xd) {
      if (TVar1 == TOKEN_GROUP) {
        parseShaderGroup(this,&local_a8);
      }
      else {
        if (TVar1 != TOKEN_CASE) goto LAB_00560923;
        parseShaderCase(this,&local_a8);
      }
    }
    if (TVar1 != TOKEN_IMPORT) break;
    parseImport(this,&local_a8);
  }
  if (TVar1 == TOKEN_END) {
    assumeToken(this,TOKEN_END);
    advanceToken(this);
    iVar3 = (**this->m_caseFactory->_vptr_ShaderCaseFactory)
                      (this->m_caseFactory,local_88,&local_68,&local_a8);
    local_48._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar3);
    std::vector<tcu::TestNode*,std::allocator<tcu::TestNode*>>::emplace_back<tcu::TestNode*>
              ((vector<tcu::TestNode*,std::allocator<tcu::TestNode*>> *)shaderNodeList,
               (TestNode **)&local_48);
    if (local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_a8.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_a8.
                            super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (local_88[0] != local_78) {
      operator_delete(local_88[0],local_78[0] + 1);
    }
    return;
  }
LAB_00560923:
  std::operator+(&local_48,"unexpected token while parsing shader group: ",&this->m_curTokenStr);
  parseError(this,&local_48);
  if (local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<tcu::TestNode_*,_std::allocator<tcu::TestNode_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void ShaderParser::parseShaderGroup (vector<tcu::TestNode*>& shaderNodeList)
{
	// Parse 'case'.
	PARSE_DBG(("  parseShaderGroup()\n"));
	advanceToken(TOKEN_GROUP);

	// Parse case name.
	string name = m_curTokenStr;
	advanceToken(); // \note [pyry] We don't want to check token type here (for instance to allow "uniform") group.

	// Parse description.
	assumeToken(TOKEN_STRING);
	string description = parseStringLiteral(m_curTokenStr.c_str());
	advanceToken(TOKEN_STRING);

	std::vector<tcu::TestNode*> children;

	// Parse group children.
	for (;;)
	{
		if (m_curToken == TOKEN_END)
			break;
		else if (m_curToken == TOKEN_GROUP)
			parseShaderGroup(children);
		else if (m_curToken == TOKEN_CASE)
			parseShaderCase(children);
		else if (m_curToken == TOKEN_IMPORT)
			parseImport(children);
		else
			parseError(string("unexpected token while parsing shader group: " + m_curTokenStr));
	}

	advanceToken(TOKEN_END); // group end

	// Create group node.
	tcu::TestCaseGroup* groupNode = m_caseFactory->createGroup(name, description, children);
	shaderNodeList.push_back(groupNode);
}